

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::AddRequiredTargetCFeature
          (cmMakefile *this,cmTarget *target,string *feature,string *error)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *test;
  char **ppcVar4;
  char **ppcVar5;
  ostream *poVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  bool needC11;
  bool needC99;
  bool needC90;
  cmTarget *local_270;
  string local_268;
  cmStrCmp local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  needC90 = false;
  needC99 = false;
  needC11 = false;
  CheckNeededCLanguage(this,feature,&needC90,&needC99,&needC11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"C_STANDARD",(allocator<char> *)&local_268);
  test = cmTarget::GetProperty(target,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  local_270 = target;
  if (test == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CMAKE_C_STANDARD_DEFAULT",(allocator<char> *)&local_268);
    test = GetDefinition(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    ppcVar4 = (char **)&DAT_0052d8c8;
    if ((test != (char *)0x0) && (*test != '\0')) goto LAB_00280683;
    bVar8 = 0;
  }
  else {
LAB_00280683:
    cmStrCmp::cmStrCmp(&local_1c8,test);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_0052d8c8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (ppcVar4 == (char **)&DAT_0052d8c8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"The C_STANDARD property on target \"");
      poVar6 = std::operator<<(poVar6,(string *)&target->Name);
      poVar6 = std::operator<<(poVar6,"\" contained an invalid value: \"");
      poVar6 = std::operator<<(poVar6,test);
      std::operator<<(poVar6,"\".");
      if (error == (string *)0x0) {
        this_00 = this->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_268,&this->Backtrace);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)error,(string *)&local_268);
      }
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
    cmStrCmp::cmStrCmp(&local_1e8,test);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_0052d8c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    bVar8 = 1;
  }
  bVar3 = needC90;
  bVar2 = needC99;
  bVar1 = needC11;
  if ((bVar8 & needC11) == 1) {
    cmStrCmp::cmStrCmp(&local_208,"11");
    ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_0052d8c8,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    if (ppcVar5 <= ppcVar4) goto LAB_002807bf;
LAB_0028086f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"C_STANDARD",(allocator<char> *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"11");
  }
  else {
LAB_002807bf:
    bVar7 = bVar8 ^ 1;
    if ((bVar8 & bVar2) == 1) {
      cmStrCmp::cmStrCmp(&local_228,"99");
      ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                          (C_STANDARDS,(char **)&DAT_0052d8c8,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      if (ppcVar5 <= ppcVar4) goto LAB_00280819;
      if ((bVar1 & bVar7) != 0) goto LAB_0028086f;
    }
    else {
LAB_00280819:
      bVar9 = bVar7 & bVar3;
      if ((bVar8 & bVar3) == 1) {
        cmStrCmp::cmStrCmp(&local_248,"90");
        ppcVar5 = std::find_if<char_const*const*,cmStrCmp>
                            (C_STANDARDS,(char **)&DAT_0052d8c8,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
        bVar9 = bVar9 | ppcVar4 < ppcVar5;
      }
      if ((bVar1 & bVar7) != 0) goto LAB_0028086f;
      if ((bVar7 & bVar2) == 0) {
        if (bVar9 == 0) {
          return true;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"C_STANDARD",(allocator<char> *)&local_268);
        cmTarget::SetProperty(local_270,(string *)&e,"90");
        std::__cxx11::string::~string((string *)&e);
        return true;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"C_STANDARD",(allocator<char> *)&local_268);
    cmTarget::SetProperty(local_270,(string *)&e,"99");
  }
  std::__cxx11::string::~string((string *)&e);
  return true;
}

Assistant:

bool cmMakefile::AddRequiredTargetCFeature(cmTarget* target,
                                           const std::string& feature,
                                           std::string* error) const
{
  bool needC90 = false;
  bool needC99 = false;
  bool needC11 = false;

  this->CheckNeededCLanguage(feature, needC90, needC99, needC11);

  const char* existingCStandard = target->GetProperty("C_STANDARD");
  if (existingCStandard == nullptr) {
    const char* defaultCStandard =
      this->GetDefinition("CMAKE_C_STANDARD_DEFAULT");
    if (defaultCStandard && *defaultCStandard) {
      existingCStandard = defaultCStandard;
    }
  }
  if (existingCStandard) {
    if (std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                     cmStrCmp(existingCStandard)) == cm::cend(C_STANDARDS)) {
      std::ostringstream e;
      e << "The C_STANDARD property on target \"" << target->GetName()
        << "\" contained an invalid value: \"" << existingCStandard << "\".";
      if (error) {
        *error = e.str();
      } else {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               e.str(), this->Backtrace);
      }
      return false;
    }
  }
  const char* const* existingCIt = existingCStandard
    ? std::find_if(cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS),
                   cmStrCmp(existingCStandard))
    : cm::cend(C_STANDARDS);

  bool setC90 = needC90 && !existingCStandard;
  bool setC99 = needC99 && !existingCStandard;
  bool setC11 = needC11 && !existingCStandard;

  if (needC11 && existingCStandard &&
      existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                 cm::cend(C_STANDARDS), cmStrCmp("11"))) {
    setC11 = true;
  } else if (needC99 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("99"))) {
    setC99 = true;
  } else if (needC90 && existingCStandard &&
             existingCIt < std::find_if(cm::cbegin(C_STANDARDS),
                                        cm::cend(C_STANDARDS),
                                        cmStrCmp("90"))) {
    setC90 = true;
  }

  if (setC11) {
    target->SetProperty("C_STANDARD", "11");
  } else if (setC99) {
    target->SetProperty("C_STANDARD", "99");
  } else if (setC90) {
    target->SetProperty("C_STANDARD", "90");
  }
  return true;
}